

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_rebuild(SAM_hdr *hdr)

{
  ushort uVar1;
  kh_sam_hdr_t *pkVar2;
  SAM_hdr_type *pSVar3;
  khint_t kVar4;
  int iVar5;
  int iVar6;
  SAM_hdr_tag *pSVar7;
  kstring_t *pkVar8;
  uint uVar9;
  char c [2];
  SAM_hdr_type *local_60;
  kstring_t ks;
  
  ks.l = 0;
  ks.m = 0;
  ks.s = (char *)0x0;
  pkVar2 = hdr->h;
  kVar4 = kh_get_sam_hdr(pkVar2,0x4844);
  iVar5 = -1;
  if (kVar4 == pkVar2->n_buckets) {
LAB_00129f55:
    for (uVar9 = 0; pkVar2 = hdr->h, uVar9 != pkVar2->n_buckets; uVar9 = uVar9 + 1) {
      if (((pkVar2->flags[uVar9 >> 4] >> ((char)uVar9 * '\x02' & 0x1fU) & 3) == 0) &&
         (pkVar2->keys[uVar9] != 0x4844)) {
        pSVar3 = pkVar2->vals[uVar9];
        local_60 = pSVar3;
        do {
          iVar5 = kputc_(0x40,&ks);
          if (iVar5 == -1) {
            return -1;
          }
          uVar1 = (ushort)hdr->h->keys[uVar9];
          c = (char  [2])(uVar1 << 8 | uVar1 >> 8);
          pkVar8 = (kstring_t *)0x2;
          iVar5 = kputsn_(c,2,&ks);
          if (iVar5 == -1) {
            return -1;
          }
          pSVar7 = (SAM_hdr_tag *)&local_60->tag;
          while (pSVar7 = pSVar7->next, pSVar7 != (SAM_hdr_tag *)0x0) {
            iVar5 = kputc_(9,&ks);
            if (iVar5 == -1) {
              return -1;
            }
            pkVar8 = (kstring_t *)(ulong)(uint)pSVar7->len;
            iVar5 = kputsn_(pSVar7->str,pSVar7->len,&ks);
            if (iVar5 == -1) {
              return -1;
            }
          }
          iVar5 = kputc((int)&ks,pkVar8);
          if (iVar5 == -1) {
            return -1;
          }
          local_60 = local_60->next;
        } while (local_60 != pSVar3);
      }
    }
    free((hdr->text).s);
    (hdr->text).s = ks.s;
    (hdr->text).l = ks.l;
    (hdr->text).m = ks.m;
    iVar5 = 0;
  }
  else {
    pSVar3 = pkVar2->vals[kVar4];
    pkVar8 = &ks;
    iVar6 = kputs("@HD",pkVar8);
    if (iVar6 != -1) {
      pSVar7 = (SAM_hdr_tag *)&pSVar3->tag;
      do {
        pSVar7 = pSVar7->next;
        if (pSVar7 == (SAM_hdr_tag *)0x0) {
          iVar5 = kputc((int)&ks,pkVar8);
          if (iVar5 == -1) {
            return -1;
          }
          goto LAB_00129f55;
        }
        iVar6 = kputc_(9,&ks);
        if (iVar6 == -1) {
          return -1;
        }
        pkVar8 = (kstring_t *)(ulong)(uint)pSVar7->len;
        iVar6 = kputsn_(pSVar7->str,pSVar7->len,&ks);
      } while (iVar6 != -1);
    }
  }
  return iVar5;
}

Assistant:

int sam_hdr_rebuild(SAM_hdr *hdr) {
    /* Order: HD then others */
    kstring_t ks = KS_INITIALIZER;
    khint_t k;


    k = kh_get(sam_hdr, hdr->h, K("HD"));
    if (k != kh_end(hdr->h)) {
	SAM_hdr_type *ty = kh_val(hdr->h, k);
	SAM_hdr_tag *tag;
	if (EOF == kputs("@HD", &ks))
	    return -1;
	for (tag = ty->tag; tag; tag = tag->next) {
	    if (EOF == kputc_('\t', &ks))
		return -1;
	    if (EOF == kputsn_(tag->str, tag->len, &ks))
		return -1;
	}
	if (EOF == kputc('\n', &ks))
	    return -1;
    }

    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;

	if (!kh_exist(hdr->h, k))
	    continue;

	if (kh_key(hdr->h, k) == K("HD"))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	do {
	    SAM_hdr_tag *tag;
	    char c[2];

	    if (EOF == kputc_('@', &ks))
		return -1;
	    c[0] = kh_key(hdr->h, k)>>8;
	    c[1] = kh_key(hdr->h, k)&0xff;
	    if (EOF == kputsn_(c, 2, &ks))
		return -1;
	    for (tag = t1->tag; tag; tag=tag->next) {
		if (EOF == kputc_('\t', &ks))
		    return -1;
		if (EOF == kputsn_(tag->str, tag->len, &ks))
		    return -1;
	    }
	    if (EOF == kputc('\n', &ks))
		return -1;
	    t1 = t1->next;
	} while (t1 != t2);
    }

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    hdr->text = ks;

    return 0;
}